

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primetest.cpp
# Opt level: O1

bool witness(int a,int n)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  
  iVar6 = 0;
  uVar9 = n;
  do {
    uVar8 = uVar9;
    uVar9 = (int)uVar8 / 2;
    iVar6 = iVar6 + 1;
  } while ((uVar9 & 1) == 0);
  lVar4 = 1;
  lVar7 = (long)n;
  if (2 < uVar8 + 1) {
    lVar5 = (long)a;
    do {
      if ((uVar9 & 1) != 0) {
        lVar4 = (lVar4 * lVar5) % lVar7;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = lVar5 * lVar5;
      lVar5 = SUB168(auVar2 % SEXT816(lVar7),0);
      bVar1 = 1 < uVar9;
      uVar9 = (int)uVar9 >> 1;
    } while (bVar1);
  }
  while (((auVar3._8_8_ = 0, auVar3._0_8_ = lVar4 * lVar4, lVar5 = SUB168(auVar3 % SEXT816(lVar7),0)
          , lVar4 == 1 || (lVar5 != 1)) || (lVar4 == n + -1))) {
    iVar6 = iVar6 + -1;
    lVar4 = lVar5;
    if (iVar6 == 0) {
      return lVar5 != 1;
    }
  }
  return true;
}

Assistant:

bool witness(int a, int n)
{
	int t, u, i;
	int64_t prev, curr;

	u = n / 2;
	t = 1;
	while (!(u & 1))
	{
		u /= 2;
		++t;
	}

	prev = power(a, u, n);
	for (i = 1; i <= t; ++i)
	{
		curr = (prev*prev) % n;
		if ((curr == 1) && (prev != 1) && (prev != n - 1))
			return true;
		prev = curr;
	}
	if (curr != 1)
		return true;
	return false;
}